

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void normalize_suite::normalize_two(void)

{
  size_type *psVar1;
  initializer_list<int> __l;
  initializer_list<int> input;
  initializer_list<int> __l_00;
  initializer_list<int> input_00;
  initializer_list<int> __l_01;
  initializer_list<int> input_01;
  initializer_list<int> __l_02;
  initializer_list<int> input_02;
  initializer_list<int> __l_03;
  initializer_list<int> input_03;
  iterator pvVar2;
  iterator pvVar3;
  reference piVar4;
  size_type sVar5;
  iterator second_begin;
  iterator second_end;
  iterator iVar6;
  iterator iVar7;
  allocator<int> local_419;
  int local_418 [2];
  iterator local_410;
  size_type local_408;
  undefined1 local_400 [8];
  vector<int,_std::allocator<int>_> expect_4;
  iterator local_3d8;
  int local_3c8 [10];
  iterator local_3a0;
  undefined8 local_398;
  iterator local_390;
  iterator local_380;
  int *local_370;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_368;
  iterator local_360;
  iterator local_350;
  allocator<int> local_339;
  int local_338 [2];
  iterator local_330;
  size_type local_328;
  undefined1 local_320 [8];
  vector<int,_std::allocator<int>_> expect_3;
  iterator local_2f8;
  int local_2e8 [10];
  iterator local_2c0;
  undefined8 local_2b8;
  iterator local_2b0;
  iterator local_2a0;
  int *local_290;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_288;
  iterator local_280;
  iterator local_270;
  allocator<int> local_259;
  int local_258 [2];
  iterator local_250;
  size_type local_248;
  undefined1 local_240 [8];
  vector<int,_std::allocator<int>_> expect_2;
  iterator local_218;
  int local_208 [6];
  iterator local_1f0;
  undefined8 local_1e8;
  iterator local_1e0;
  iterator local_1d0;
  int *local_1c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  iterator local_1b0;
  iterator local_1a0;
  allocator<int> local_189;
  int local_188 [2];
  iterator local_180;
  size_type local_178;
  undefined1 local_170 [8];
  vector<int,_std::allocator<int>_> expect_1;
  iterator local_148;
  int local_138 [6];
  iterator local_120;
  undefined8 local_118;
  iterator local_110;
  iterator local_100;
  int *local_f0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  iterator local_e0;
  iterator local_d0;
  allocator<int> local_a9;
  int local_a8 [2];
  iterator local_a0;
  size_type local_98;
  undefined1 local_90 [8];
  vector<int,_std::allocator<int>_> expect;
  iterator local_68;
  int local_58 [4];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::end((array<int,_4UL> *)psVar1);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,pvVar2,pvVar3);
  local_58[0] = 0xb;
  local_58[1] = 0x16;
  local_58[2] = 0x21;
  local_58[3] = 0x2c;
  local_48 = local_58;
  local_40 = 4;
  input_03._M_len = 4;
  input_03._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_03);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_68);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe80,"void normalize_suite::normalize_two()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe82,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  local_a8[0] = 0x21;
  local_a8[1] = 0x2c;
  local_a0 = local_a8;
  local_98 = 2;
  std::allocator<int>::allocator(&local_a9);
  __l_03._M_len = local_98;
  __l_03._M_array = local_a0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_90,__l_03,&local_a9);
  std::allocator<int>::~allocator(&local_a9);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_e0 = vista::circular_view<int,_18446744073709551615UL>::end
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_e8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_90);
  local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)local_90);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe86,"void normalize_suite::normalize_two()",local_d0,local_e0,local_e8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_f0);
  local_100 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_110 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe88,"void normalize_suite::normalize_two()",local_100,local_110,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  local_138[0] = 0xb;
  local_138[1] = 0x16;
  local_138[2] = 0x21;
  local_138[3] = 0x2c;
  local_138[4] = 0x37;
  local_120 = local_138;
  local_118 = 5;
  input_02._M_len = 5;
  input_02._M_array = local_120;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_02);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_148 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_148);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe8e,"void normalize_suite::normalize_two()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe90,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  local_188[0] = 0x2c;
  local_188[1] = 0x37;
  local_180 = local_188;
  local_178 = 2;
  std::allocator<int>::allocator(&local_189);
  __l_02._M_len = local_178;
  __l_02._M_array = local_180;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_170,__l_02,&local_189);
  std::allocator<int>::~allocator(&local_189);
  local_1a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1b0 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1b8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_170);
  local_1c0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_170);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe94,"void normalize_suite::normalize_two()",local_1a0,local_1b0,local_1b8,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1c0);
  local_1d0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1e0 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe96,"void normalize_suite::normalize_two()",local_1d0,local_1e0,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  local_208[4] = 0x37;
  local_208[5] = 0x42;
  local_208[0] = 0xb;
  local_208[1] = 0x16;
  local_208[2] = 0x21;
  local_208[3] = 0x2c;
  local_1f0 = local_208;
  local_1e8 = 6;
  input_01._M_len = 6;
  input_01._M_array = local_1f0;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_01);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_218 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_218);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9c,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xe9e,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  local_258[0] = 0x37;
  local_258[1] = 0x42;
  local_250 = local_258;
  local_248 = 2;
  std::allocator<int>::allocator(&local_259);
  __l_01._M_len = local_248;
  __l_01._M_array = local_250;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_240,__l_01,&local_259);
  std::allocator<int>::~allocator(&local_259);
  local_270 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_280 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_288._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_240);
  local_290 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_240);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xea2,"void normalize_suite::normalize_two()",local_270,local_280,local_288,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_290);
  local_2a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2b0 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xea4,"void normalize_suite::normalize_two()",local_2a0,local_2b0,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_240);
  local_2e8[4] = 0x37;
  local_2e8[5] = 0x42;
  local_2e8[6] = 0x4d;
  local_2e8[0] = 0xb;
  local_2e8[1] = 0x16;
  local_2e8[2] = 0x21;
  local_2e8[3] = 0x2c;
  local_2c0 = local_2e8;
  local_2b8 = 7;
  input_00._M_len = 7;
  input_00._M_array = local_2c0;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input_00);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_2f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_2f8);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeaa,"void normalize_suite::normalize_two()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeac,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  local_338[0] = 0x42;
  local_338[1] = 0x4d;
  local_330 = local_338;
  local_328 = 2;
  std::allocator<int>::allocator(&local_339);
  __l_00._M_len = local_328;
  __l_00._M_array = local_330;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_320,__l_00,&local_339);
  std::allocator<int>::~allocator(&local_339);
  local_350 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_360 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_368._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_320);
  local_370 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_320);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb0,"void normalize_suite::normalize_two()",local_350,local_360,local_368,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_370);
  local_380 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_390 = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb2,"void normalize_suite::normalize_two()",local_380,local_390,pvVar2,
             pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_320);
  local_3c8[4] = 0x37;
  local_3c8[5] = 0x42;
  local_3c8[6] = 0x4d;
  local_3c8[7] = 0x58;
  local_3c8[0] = 0xb;
  local_3c8[1] = 0x16;
  local_3c8[2] = 0x21;
  local_3c8[3] = 0x2c;
  local_3a0 = local_3c8;
  local_398 = 8;
  input._M_len = 8;
  input._M_array = local_3a0;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::remove_front
            ((circular_view<int,_18446744073709551615UL> *)local_38,2);
  local_3d8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_3d8);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeb8,"void normalize_suite::normalize_two()",piVar4 != pvVar2);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front
            ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar4 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)
                      &expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xeba,"void normalize_suite::normalize_two()",piVar4 == pvVar2);
  local_418[0] = 0x4d;
  local_418[1] = 0x58;
  local_410 = local_418;
  local_408 = 2;
  std::allocator<int>::allocator(&local_419);
  __l._M_len = local_408;
  __l._M_array = local_410;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_400,__l,&local_419);
  std::allocator<int>::~allocator(&local_419);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_400);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_400);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xebe,"void normalize_suite::normalize_two()",iVar6,iVar7,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  iVar6 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  psVar1 = &span.member.next;
  pvVar2 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)psVar1);
  sVar5 = vista::circular_view<int,_18446744073709551615UL>::size
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xec0,"void normalize_suite::normalize_two()",iVar6,iVar7,pvVar2,pvVar3 + sVar5);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_400);
  return;
}

Assistant:

void normalize_two()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // X X 33 44 => 33 44 X X
        span = { 11, 22, 33, 44 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 55 X X 44 => 44 55 X X
        span = { 11, 22, 33, 44, 55 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 55 66 X X => 55 66 X X
        span = { 11, 22, 33, 44, 55, 66 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X 66 77 X => 66 77 X X
        span = { 11, 22, 33, 44, 55, 66, 77 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 66, 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // X X 77 88 => 77 88 X X
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        span.remove_front(2);
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 77, 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
}